

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *x)

{
  uint uVar1;
  unsigned_fast_type field_width;
  uint_fast8_t uVar2;
  uint_fast8_t base_rep;
  char fill_char_str;
  ostream *poVar3;
  ulong uVar4;
  allocator_type local_1ca;
  value_type local_1c9;
  string_storage_dec_type str_result;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  uVar1 = *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  uVar2 = '\x10';
  if ((uVar1 & 8) == 0) {
    uVar2 = '\n';
  }
  base_rep = '\b';
  if ((uVar1 & 0x40) == 0) {
    base_rep = uVar2;
  }
  field_width = *(unsigned_fast_type *)(out + *(long *)(*(long *)out + -0x18) + 0x10);
  fill_char_str = std::ios::fill();
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 0x48) == 8) {
      local_1c9 = '\0';
      detail::fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
                ((fixed_dynamic_array<char,_32776U,_std::allocator<unsigned_int>_> *)&str_result,
                 0x8008,&local_1c9,&local_1ca);
      for (uVar4 = 0;
          str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count != uVar4; uVar4 = uVar4 + 1) {
        str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar4] = '\0';
      }
      uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
                ((uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *)x,
                 str_result.
                 super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,
                 base_rep,(bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xb) & 1),
                 (bool)((byte)(uVar1 >> 0xe) & 1),field_width,fill_char_str);
      std::operator<<((ostream *)&ostr,
                      str_result.
                      super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                      elems);
    }
    else {
      if ((uVar1 & 0x48) != 0) goto LAB_001300a8;
      local_1c9 = '\0';
      detail::fixed_dynamic_array<char,_39462U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
                (&str_result,0x9a26,&local_1c9,&local_1ca);
      for (uVar4 = 0;
          str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          elem_count != uVar4; uVar4 = uVar4 + 1) {
        str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
        [uVar4] = '\0';
      }
      uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
                ((uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *)x,
                 str_result.
                 super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems,
                 base_rep,(bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xb) & 1),
                 (bool)((byte)(uVar1 >> 0xe) & 1),field_width,fill_char_str);
      std::operator<<((ostream *)&ostr,
                      str_result.
                      super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                      elems);
    }
  }
  else {
    local_1c9 = '\0';
    detail::fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_43699U,_std::allocator<unsigned_int>_> *)&str_result,
               0xaab3,&local_1c9,&local_1ca);
    for (uVar4 = 0;
        str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        elem_count != uVar4; uVar4 = uVar4 + 1) {
      str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
      [uVar4] = '\0';
    }
    uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::wr_string<char*>
              ((uintwide_t<131072u,unsigned_int,std::allocator<void>,false> *)x,
               str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
               .elems,base_rep,(bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xb) & 1),
               (bool)((byte)(uVar1 >> 0xe) & 1),field_width,fill_char_str);
    std::operator<<((ostream *)&ostr,
                    str_result.
                    super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems
                   );
  }
  util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            (&str_result.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>)
  ;
LAB_001300a8:
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(out,(string *)&str_result);
  std::__cxx11::string::~string((string *)&str_result);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return poVar3;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }